

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-randart.c
# Opt level: O0

void count_weapon_abilities(artifact *art,artifact_set_data *data)

{
  _Bool _Var1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  wchar_t wVar6;
  object_kind *poVar7;
  wchar_t min_to_a;
  wchar_t min_to_d;
  wchar_t min_to_h;
  object_kind *kind;
  wchar_t bonus;
  artifact_set_data *data_local;
  artifact *art_local;
  
  poVar7 = lookup_kind(art->tval,art->sval);
  iVar2 = randcalc(poVar7->to_h,0,MINIMISE);
  iVar3 = randcalc(poVar7->to_d,0,MINIMISE);
  iVar4 = randcalc(poVar7->to_a,0,MINIMISE);
  uVar5 = ((art->to_h - iVar2) - data->hit_startval) / data->hit_increment;
  if ((int)uVar5 < 1) {
    if ((int)uVar5 < 0) {
      file_putf(log_file,"Subtracting %d instances of extra to-hit bonus for weapon\n",(ulong)uVar5)
      ;
    }
  }
  else {
    file_putf(log_file,"Adding %d instances of extra to-hit bonus for weapon\n",(ulong)uVar5);
  }
  data->art_probs[4] = uVar5 + data->art_probs[4];
  uVar5 = ((art->to_d - iVar3) - data->dam_startval) / data->dam_increment;
  if ((int)uVar5 < 1) {
    file_putf(log_file,"Subtracting %d instances of extra to-dam bonus for weapon\n",(ulong)uVar5);
  }
  else {
    file_putf(log_file,"Adding %d instances of extra to-dam bonus for weapon\n",(ulong)uVar5);
  }
  data->art_probs[5] = uVar5 + data->art_probs[5];
  uVar5 = (art->to_a - iVar4) / data->ac_increment;
  if (art->to_a < 0x15) {
    if (0 < (int)uVar5) {
      file_putf(log_file,"Adding %d instances of extra AC bonus for weapon\n",(ulong)uVar5);
      data->art_probs[0x12] = uVar5 + data->art_probs[0x12];
    }
  }
  else {
    file_putf(log_file,"Adding %d for supercharged AC\n",(ulong)uVar5);
    data->art_probs[0x5c] = data->art_probs[0x5c] + 1;
  }
  if (poVar7->dd < art->dd) {
    if (art->dd - poVar7->dd < 3) {
      file_putf(log_file,"Adding 1 for extra damage dice.\n");
      data->art_probs[0x13] = data->art_probs[0x13] + 1;
    }
    else {
      file_putf(log_file,"Adding 1 for super-charged damage dice!\n");
      data->art_probs[0x57] = data->art_probs[0x57] + 1;
    }
  }
  if (art->weight != poVar7->weight) {
    file_putf(log_file,"Adding 1 for unusual weight.\n");
    data->art_probs[0x14] = data->art_probs[0x14] + 1;
  }
  if (art->modifiers[10] < 3) {
    if (0 < art->modifiers[10]) {
      file_putf(log_file,"Adding 1 for extra blows\n");
      data->art_probs[0x11] = data->art_probs[0x11] + 1;
    }
  }
  else {
    file_putf(log_file,"Adding 1 for supercharged blows (3 or more!)\n");
    data->art_probs[0x5b] = data->art_probs[0x5b] + 1;
  }
  _Var1 = flag_has_dbg(art->flags,5,0x1a,"art->flags","OF_AGGRAVATE");
  if (_Var1) {
    file_putf(log_file,"Adding 1 for aggravation - weapon\n");
    data->art_probs[0x55] = data->art_probs[0x55] + 1;
  }
  _Var1 = flag_has_dbg(art->flags,5,0x12,"art->flags","OF_BLESSED");
  if (_Var1) {
    file_putf(log_file,"Adding 1 for blessed weapon\n");
    data->art_probs[0xd] = data->art_probs[0xd] + 1;
  }
  _Var1 = flag_has_dbg(art->flags,5,0xe,"art->flags","OF_SEE_INVIS");
  if (_Var1) {
    file_putf(log_file,"Adding 1 for see invisible (weapon case)\n");
    data->art_probs[0x10] = data->art_probs[0x10] + 1;
  }
  if (0 < art->modifiers[8]) {
    file_putf(log_file,"Adding 1 for tunnelling bonus.\n");
    data->art_probs[0x15] = data->art_probs[0x15] + 1;
  }
  if (art->slays != (_Bool *)0x0) {
    wVar6 = slay_count(art->slays);
    data->art_probs[0xf] = wVar6 + data->art_probs[0xf];
    file_putf(log_file,"Adding %d for slays\n",(ulong)(uint)wVar6);
  }
  if (art->brands != (_Bool *)0x0) {
    wVar6 = brand_count(art->brands);
    data->art_probs[0xe] = wVar6 + data->art_probs[0xe];
    file_putf(log_file,"Adding %d for brands\n",(ulong)(uint)wVar6);
  }
  return;
}

Assistant:

static void count_weapon_abilities(const struct artifact *art,
							struct artifact_set_data *data)
{
	int bonus;
	struct object_kind *kind = lookup_kind(art->tval, art->sval);
	int min_to_h = randcalc(kind->to_h, 0, MINIMISE);
	int min_to_d = randcalc(kind->to_d, 0, MINIMISE);
	int min_to_a = randcalc(kind->to_a, 0, MINIMISE);

	/* To-hit and to-dam */
	bonus = (art->to_h - min_to_h - data->hit_startval) / data->hit_increment;
	if (bonus > 0)
		file_putf(log_file, "Adding %d instances of extra to-hit bonus for weapon\n", bonus);
	else if (bonus < 0)
		file_putf(log_file, "Subtracting %d instances of extra to-hit bonus for weapon\n", bonus);
	data->art_probs[ART_IDX_WEAPON_HIT] += bonus;

	bonus = (art->to_d - min_to_d - data->dam_startval) / data->dam_increment;
	if (bonus > 0)
		file_putf(log_file, "Adding %d instances of extra to-dam bonus for weapon\n", bonus);
	else
		file_putf(log_file, "Subtracting %d instances of extra to-dam bonus for weapon\n", bonus);
	data->art_probs[ART_IDX_WEAPON_DAM] += bonus;

	/* Does this weapon have an unusual bonus to AC? */
	bonus = (art->to_a - min_to_a) / data->ac_increment;
	if (art->to_a > 20) {
		file_putf(log_file, "Adding %d for supercharged AC\n", bonus);
		(data->art_probs[ART_IDX_MELEE_AC_SUPER])++;
	} else if (bonus > 0) {
		file_putf(log_file,
				  "Adding %d instances of extra AC bonus for weapon\n", bonus);
		(data->art_probs[ART_IDX_MELEE_AC]) += bonus;
	}

	/* Check damage dice - are they more than normal? */
	if (art->dd > kind->dd) {
		/* Difference of 3 or more? */
		if ((art->dd - kind->dd) > 2) {
			file_putf(log_file, "Adding 1 for super-charged damage dice!\n");
			(data->art_probs[ART_IDX_MELEE_DICE_SUPER])++;
		} else {
			file_putf(log_file, "Adding 1 for extra damage dice.\n");
			(data->art_probs[ART_IDX_MELEE_DICE])++;
		}
	}

	/* Check weight - is it different from normal? */
	if (art->weight != kind->weight) {
		file_putf(log_file, "Adding 1 for unusual weight.\n");
		(data->art_probs[ART_IDX_MELEE_WEIGHT])++;
	}

	/* Do we have 3 or more extra blows? (Unlikely) */
	if (art->modifiers[OBJ_MOD_BLOWS] > 2) {
		file_putf(log_file, "Adding 1 for supercharged blows (3 or more!)\n");
		(data->art_probs[ART_IDX_MELEE_BLOWS_SUPER])++;
	} else if (art->modifiers[OBJ_MOD_BLOWS] > 0) {
		file_putf(log_file, "Adding 1 for extra blows\n");
		(data->art_probs[ART_IDX_MELEE_BLOWS])++;
	}

	/* Aggravation */
	if (of_has(art->flags, OF_AGGRAVATE)) {
		file_putf(log_file, "Adding 1 for aggravation - weapon\n");
		data->art_probs[ART_IDX_WEAPON_AGGR]++;
	}

	/* Blessed weapon? */
	if (of_has(art->flags, OF_BLESSED)) {
		file_putf(log_file, "Adding 1 for blessed weapon\n");
		(data->art_probs[ART_IDX_MELEE_BLESS])++;
	}

	/* See invisible? */
	if (of_has(art->flags, OF_SEE_INVIS)) {
		file_putf(log_file, "Adding 1 for see invisible (weapon case)\n");
		(data->art_probs[ART_IDX_MELEE_SINV])++;
	}

	/* Check for tunnelling ability */
	if (art->modifiers[OBJ_MOD_TUNNEL] > 0) {
		file_putf(log_file, "Adding 1 for tunnelling bonus.\n");
		(data->art_probs[ART_IDX_MELEE_TUNN])++;
	}

	/* Count brands and slays */
	if (art->slays) {
		bonus = slay_count(art->slays);
		data->art_probs[ART_IDX_MELEE_SLAY] += bonus;
		file_putf(log_file, "Adding %d for slays\n", bonus);
	}
	if (art->brands) {
		bonus = brand_count(art->brands);
		data->art_probs[ART_IDX_MELEE_BRAND] += bonus;
		file_putf(log_file, "Adding %d for brands\n", bonus);
	}
}